

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O2

bool __thiscall TGAImage::unload_rle_data(TGAImage *this,ofstream *out)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  pointer puVar4;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t t;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar10 = (ulong)(this->height * this->width);
  uVar8 = 0;
  do {
    uVar6 = uVar8;
    if (uVar10 <= uVar6) goto LAB_00105ad4;
    uVar3 = (ulong)this->bytespp;
    puVar4 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = puVar4 + (uVar6 + 1) * uVar3;
    puVar4 = puVar4 + uVar6 * uVar3;
    uVar8 = 1;
    bVar2 = true;
    do {
      uVar7 = uVar8 & 0xffffffff;
      if (((char)uVar8 < '\0') || (uVar10 <= uVar8 + uVar6)) break;
      bVar11 = true;
      for (uVar9 = 0; (bVar11 && (uVar9 < uVar3)); uVar9 = uVar9 + 1) {
        bVar11 = puVar4[uVar9] == puVar5[uVar9];
      }
      bVar1 = (bool)(~bVar11 & 1);
      if (uVar8 != 1) {
        bVar1 = bVar2;
      }
      if ((bool)(bVar11 & bVar1)) {
        uVar7 = (ulong)((int)uVar8 - 1);
        break;
      }
      uVar8 = uVar8 + 1;
      puVar5 = puVar5 + uVar3;
      puVar4 = puVar4 + uVar3;
      bVar2 = bVar1;
    } while (bVar11 || bVar1);
    std::ostream::put((char)out);
    if (*(int *)(out + *(long *)(*(long *)out + -0x18) + 0x20) != 0) break;
    std::ostream::write((char *)out,
                        (long)((this->data).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar6 * uVar3));
    uVar8 = (uVar7 & 0xff) + uVar6;
  } while (*(int *)(out + *(long *)(*(long *)out + -0x18) + 0x20) == 0);
  std::operator<<((ostream *)&std::cerr,"can\'t dump the tga file\n");
LAB_00105ad4:
  return uVar10 <= uVar6;
}

Assistant:

bool TGAImage::unload_rle_data(std::ofstream &out) const
{
    const std::uint8_t max_chunk_length = 128;
    size_t n_pixels = width * height;
    size_t curpix = 0;
    while (curpix < n_pixels) {
        size_t chunkstart = curpix * bytespp;
        size_t curbyte = curpix * bytespp;
        std::uint8_t run_length = 1;
        bool raw = true;
        while (curpix + run_length < n_pixels && run_length < max_chunk_length) {
            bool succ_eq = true;
            for (size_t t = 0; succ_eq && t < bytespp; t++)
                succ_eq = (data[curbyte + t] == data[curbyte + t + bytespp]);
            curbyte += bytespp;
            if (1 == run_length) raw = !succ_eq;
            if (raw && succ_eq) {
                run_length--;
                break;
            }
            if (!raw && !succ_eq) break;
            run_length++;
        }
        curpix += run_length;
        out.put(raw ? run_length - 1 : run_length + 127);
        if (!out.good()) {
            std::cerr << "can't dump the tga file\n";
            return false;
        }
        out.write(reinterpret_cast<const char *>(data.data() + chunkstart),
                  (raw ? run_length * bytespp : bytespp));
        if (!out.good()) {
            std::cerr << "can't dump the tga file\n";
            return false;
        }
    }
    return true;
}